

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.hpp
# Opt level: O2

void __thiscall
helics::BasicHandleInfo::BasicHandleInfo(BasicHandleInfo *this,BasicHandleInfo *param_1)

{
  string *psVar1;
  LocalFederateId LVar2;
  InterfaceType IVar3;
  bool bVar4;
  uint16_t uVar5;
  
  LVar2.fid = (param_1->local_fed_id).fid;
  IVar3 = param_1->handleType;
  bVar4 = param_1->used;
  uVar5 = param_1->flags;
  this->handle = param_1->handle;
  this->local_fed_id = (LocalFederateId)LVar2.fid;
  this->handleType = IVar3;
  this->used = bVar4;
  this->flags = uVar5;
  std::__cxx11::string::string((string *)&this->key,&param_1->key);
  std::__cxx11::string::string((string *)&this->type,&param_1->type);
  std::__cxx11::string::string((string *)&this->units,&param_1->units);
  psVar1 = param_1->type_out;
  this->type_in = param_1->type_in;
  this->type_out = psVar1;
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->tags,&param_1->tags);
  return;
}

Assistant:

BasicHandleInfo() noexcept: type_in(type), type_out(units) {}